

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::redeclareBuiltinBlock
          (TParseContext *this,TSourceLoc *loc,TTypeList *newTypeList,TString *blockName,
          TString *instanceName,TArraySizes *arraySizes)

{
  long *plVar1;
  pointer *pppTVar2;
  undefined8 *puVar3;
  TType *right;
  TType *this_00;
  undefined8 uVar4;
  ulong uVar5;
  TArraySizes *pTVar6;
  TVector<glslang::TArraySize> *pTVar7;
  iterator __position;
  char cVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar14;
  long lVar15;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_01;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  TString *pTVar16;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  TSmallArrayVector *pTVar17;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  undefined4 extraout_var_51;
  char *pcVar18;
  pointer pcVar19;
  char *pcVar20;
  pointer pTVar21;
  undefined8 *__src;
  TSourceLoc *pTVar22;
  TSymbolTable *this_02;
  char *pcVar23;
  _func_int *UNRECOVERED_JUMPTABLE;
  _func_int **pp_Var24;
  undefined8 *__dest;
  bool builtIn;
  TSourceLoc memberLoc;
  bool local_91;
  TSymbol *local_90;
  TSourceLoc *local_88;
  TArraySizes *local_80;
  TSourceLoc local_78;
  TParseContext *local_58;
  long *local_50;
  ulong local_48;
  TString *local_40;
  TString *local_38;
  undefined4 extraout_var_02;
  
  local_80 = arraySizes;
  TParseVersions::profileRequires
            ((TParseVersions *)this,loc,8,0x140,2,(char **)AEP_shader_io_blocks,
             "built-in block redeclaration");
  TParseVersions::profileRequires
            ((TParseVersions *)this,loc,-9,0x19a,"GL_ARB_separate_shader_objects",
             "built-in block redeclaration");
  iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::compare(blockName,"gl_PerVertex");
  if (((((iVar10 != 0) &&
        (iVar10 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(blockName,"gl_PerFragment"), iVar10 != 0)) &&
       (iVar10 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                           (blockName,"gl_MeshPerVertexNV"), iVar10 != 0)) &&
      ((iVar10 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                           (blockName,"gl_MeshPerPrimitiveNV"), iVar10 != 0 &&
       (iVar10 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                           (blockName,"gl_MeshPerVertexEXT"), iVar10 != 0)))) &&
     (iVar10 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                         (blockName,"gl_MeshPerPrimitiveEXT"), iVar10 != 0)) {
    pcVar23 = (blockName->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar20 = "cannot redeclare block: ";
    pcVar18 = "block declaration";
LAB_0042dc11:
    (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar20,pcVar18,pcVar23,UNRECOVERED_JUMPTABLE);
    return;
  }
  if (instanceName == (TString *)0x0) {
    this_02 = (this->super_TParseContextBase).symbolTable;
    iVar10 = (*((newTypeList->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_start)->type->_vptr_TType[6])();
    pTVar16 = (TString *)CONCAT44(extraout_var,iVar10);
  }
  else {
    iVar10 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                       (instanceName,0,3,"gl_");
    if (iVar10 != 0) {
      pcVar18 = (instanceName->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar20 = "cannot redeclare a built-in block with a user name";
      pcVar23 = "";
      goto LAB_0042dc11;
    }
    this_02 = (this->super_TParseContextBase).symbolTable;
    pTVar16 = instanceName;
  }
  local_90 = TSymbolTable::find(this_02,pTVar16,&local_91,(bool *)0x0,(int *)0x0);
  local_40 = instanceName;
  if (instanceName == (TString *)0x0) {
    iVar10 = (*((newTypeList->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_start)->type->_vptr_TType[6])();
    instanceName = (TString *)CONCAT44(extraout_var_00,iVar10);
  }
  pcVar19 = (instanceName->_M_dataplus)._M_p;
  if (local_90 == (TSymbol *)0x0) {
    pp_Var24 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar23 = "no declaration found for redeclaration";
  }
  else if (local_91 == false) {
    pcVar19 = (blockName->_M_dataplus)._M_p;
    pp_Var24 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar23 = "can only redeclare a built-in block once, and before any use";
  }
  else {
    local_90 = TSymbolTable::copyUpDeferredInsert
                         ((this->super_TParseContextBase).symbolTable,local_90);
    iVar10 = (*local_90->_vptr_TSymbol[0xc])(local_90);
    iVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar10) + 0x38))
                       ((long *)CONCAT44(extraout_var_01,iVar10));
    pTVar16 = local_40;
    if (iVar10 == 0x10) {
      if (((*(uint *)&(this->currentBlockQualifier).field_0x8 & 0x7f) == 4) &&
         ((~*(uint *)&(this->globalOutputDefaults).field_0x24 & 0xf) != 0)) {
        if ((~*(uint *)&(this->currentBlockQualifier).field_0x24 & 0xf) == 0) {
          *(ulong *)&(this->currentBlockQualifier).field_0x24 =
               *(ulong *)&(this->currentBlockQualifier).field_0x24 & 0xfffffffffffffff0 |
               (ulong)((uint)*(undefined8 *)&(this->globalOutputDefaults).field_0x24 & 0xf);
        }
        if (0xfeffffffffffffff < *(ulong *)&(this->currentBlockQualifier).field_0x1c) {
          *(ulong *)&(this->currentBlockQualifier).field_0x1c =
               *(ulong *)&(this->currentBlockQualifier).field_0x1c & 0xffffffffffffff |
               *(ulong *)&(this->globalOutputDefaults).field_0x1c & 0xff00000000000000;
        }
        fixXfbOffsets(this,&this->currentBlockQualifier,newTypeList);
      }
      iVar10 = (*local_90->_vptr_TSymbol[0xd])();
      plVar14 = (long *)CONCAT44(extraout_var_02,iVar10);
      if ((this->currentBlockQualifier).layoutPassthrough == true) {
        lVar15 = (**(code **)(*plVar14 + 0x50))(plVar14);
        *(undefined1 *)(lVar15 + 0x2f) = 1;
        local_88 = (TSourceLoc *)
                   (ulong)((uint)*(undefined8 *)&(this->currentBlockQualifier).field_0x8 & 0x7f);
        lVar15 = (**(code **)(*plVar14 + 0x50))(plVar14);
        *(ulong *)(lVar15 + 8) = (*(ulong *)(lVar15 + 8) & 0xffffffffffffff80) + (long)local_88;
        local_88 = (TSourceLoc *)
                   (*(ulong *)&(this->currentBlockQualifier).field_0x1c & 0xff00000000000000);
        lVar15 = (**(code **)(*plVar14 + 0x50))(plVar14);
        *(ulong *)(lVar15 + 0x1c) = *(ulong *)(lVar15 + 0x1c) & 0xffffffffffffff | (ulong)local_88;
        local_88 = (TSourceLoc *)
                   (ulong)((uint)*(undefined8 *)&(this->currentBlockQualifier).field_0x24 & 0xf);
        lVar15 = (**(code **)(*plVar14 + 0x50))(plVar14);
        *(ulong *)(lVar15 + 0x24) =
             (*(ulong *)(lVar15 + 0x24) & 0xfffffffffffffff0) + (long)local_88;
      }
      local_88 = loc;
      local_38 = blockName;
      cVar8 = (**(code **)(*plVar14 + 0x128))(plVar14);
      if (cVar8 != '\0') {
        __dest = *(undefined8 **)(plVar14[0xd] + 8);
        cVar8 = (**(code **)(*plVar14 + 0x128))(plVar14);
        if (cVar8 != '\0') {
          local_48 = 0;
          local_58 = this;
          local_50 = plVar14;
          do {
            if (__dest == *(undefined8 **)(plVar14[0xd] + 0x10)) {
              if (0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan) {
                uVar5 = *(ulong *)&(this->currentBlockQualifier).field_0x1c;
                lVar15 = (**(code **)(*plVar14 + 0x50))(plVar14);
                *(ulong *)(lVar15 + 0x1c) =
                     *(ulong *)(lVar15 + 0x1c) & 0xffffffffffffff | uVar5 & 0xff00000000000000;
              }
              pTVar16 = local_38;
              pTVar22 = local_88;
              if (local_48 <
                  (ulong)((long)(newTypeList->
                                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ).
                                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(newTypeList->
                                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ).
                                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,local_88,"block redeclaration has extra members",
                           (local_38->_M_dataplus)._M_p,"");
              }
              cVar8 = (**(code **)(*plVar14 + 0xe8))(plVar14);
              pcVar23 = "cannot change arrayness of redeclared block";
              if ((local_80 != (TArraySizes *)0x0) == (bool)cVar8) {
                cVar8 = (**(code **)(*plVar14 + 0xe8))(plVar14);
                if ((local_80 != (TArraySizes *)0x0) && (cVar8 != '\0')) {
                  lVar15 = (**(code **)(*plVar14 + 0xa0))(plVar14);
                  lVar15 = *(long *)(lVar15 + 8);
                  iVar10 = 0;
                  iVar11 = 0;
                  if (lVar15 != 0) {
                    iVar11 = (int)((ulong)(*(long *)(lVar15 + 0x10) - *(long *)(lVar15 + 8)) >> 4);
                  }
                  pTVar7 = (local_80->sizes).sizes;
                  if (pTVar7 != (TVector<glslang::TArraySize> *)0x0) {
                    iVar10 = (int)((ulong)((long)(pTVar7->
                                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                                 ).
                                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pTVar7->
                                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                                ).
                                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
                  }
                  if (iVar11 != iVar10) goto LAB_0042e8b8;
                }
                cVar8 = (**(code **)(*plVar14 + 0xe8))(plVar14);
                if (cVar8 == '\0') goto LAB_0042ea01;
                uVar13 = TSmallArrayVector::frontSize(&local_80->sizes);
                if ((uVar13 == 0) &&
                   (cVar8 = (**(code **)(*plVar14 + 0xf0))(plVar14), cVar8 != '\0')) {
                  uVar13 = (**(code **)(*plVar14 + 0x78))(plVar14);
                  pTVar6 = local_80;
                  TSmallArrayVector::changeFront(&local_80->sizes,uVar13);
                  pTVar6->implicitlySized = false;
                }
                cVar8 = (**(code **)(*plVar14 + 0xf0))(plVar14);
                if ((cVar8 == '\0') &&
                   (uVar13 = TSmallArrayVector::frontSize(&local_80->sizes), uVar13 != 0)) {
                  uVar13 = TSmallArrayVector::frontSize(&local_80->sizes);
                  pTVar17 = (TSmallArrayVector *)plVar14[0xc];
                  TSmallArrayVector::changeFront(pTVar17,uVar13);
                  *(undefined1 *)((long)&pTVar17[1]._vptr_TSmallArrayVector + 4) = 0;
                }
                cVar8 = (**(code **)(*plVar14 + 0xf0))(plVar14);
                if (cVar8 == '\0') goto LAB_0042ea01;
                pTVar17 = (TSmallArrayVector *)(**(code **)(*plVar14 + 0xa0))(plVar14);
                bVar9 = TSmallArrayVector::operator==(pTVar17,&local_80->sizes);
                if (bVar9) goto LAB_0042ea01;
                pcVar23 = "cannot change array size of redeclared block";
              }
LAB_0042e8b8:
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,pTVar22,pcVar23,(pTVar16->_M_dataplus)._M_p,"");
LAB_0042ea01:
              TSymbolTable::insert((this->super_TParseContextBase).symbolTable,local_90);
              layoutObjectCheck(this,pTVar22,local_90);
              iVar10 = (*local_90->_vptr_TSymbol[0xc])();
              bVar9 = isIoResizeArray(this,(TType *)CONCAT44(extraout_var_49,iVar10));
              if (bVar9) {
                __position._M_current =
                     (this->ioArraySymbolResizeList).
                     super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
                     super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->ioArraySymbolResizeList).
                    super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
                    super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<glslang::TSymbol*,glslang::pool_allocator<glslang::TSymbol*>>::
                  _M_realloc_insert<glslang::TSymbol*const&>
                            ((vector<glslang::TSymbol*,glslang::pool_allocator<glslang::TSymbol*>> *
                             )&this->ioArraySymbolResizeList,__position,&local_90);
                }
                else {
                  *__position._M_current = local_90;
                  pppTVar2 = &(this->ioArraySymbolResizeList).
                              super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                              .
                              super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  *pppTVar2 = *pppTVar2 + 1;
                }
                checkIoArraysConsistency(this,pTVar22,true);
              }
              else {
                iVar10 = (*local_90->_vptr_TSymbol[0xc])();
                cVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_50,iVar10) + 0xe8))
                                  ((long *)CONCAT44(extraout_var_50,iVar10));
                if (cVar8 != '\0') {
                  iVar10 = (*local_90->_vptr_TSymbol[0xd])();
                  fixIoArraySize(this,pTVar22,(TType *)CONCAT44(extraout_var_51,iVar10));
                }
              }
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                        (this,local_90);
              return;
            }
            local_78.name = (TString *)0x0;
            local_78.string = 0;
            local_78.line = 0;
            local_78._16_8_ = local_78._16_8_ & 0xffffffff00000000;
            for (pTVar21 = (newTypeList->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ).
                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ._M_impl.super__Vector_impl_data._M_start; plVar14 = local_50,
                pTVar21 !=
                (newTypeList->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_finish; pTVar21 = pTVar21 + 1) {
              this_01 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)(**(code **)(*(long *)*__dest + 0x30))();
              iVar10 = (*pTVar21->type->_vptr_TType[6])();
              iVar10 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       compare(this_01,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                        *)CONCAT44(extraout_var_03,iVar10));
              if (iVar10 == 0) {
                local_78._16_8_ = *(undefined8 *)&(pTVar21->loc).column;
                local_78.name = (pTVar21->loc).name;
                local_78.string = (pTVar21->loc).string;
                local_78.line = (pTVar21->loc).line;
                right = (TType *)*__dest;
                this_00 = pTVar21->type;
                if ((right->field_0x8 != this_00->field_0x8) ||
                   (bVar9 = TType::sameElementShape(this_00,right,(int *)0x0,(int *)0x0), !bVar9)) {
                  lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,&local_78,"cannot redeclare block member with a different type",
                             *(undefined8 *)(lVar15 + 8),"");
                }
                iVar10 = (*right->_vptr_TType[0x1d])(right);
                iVar11 = (*this_00->_vptr_TType[0x1d])(this_00);
                if ((char)iVar10 == (char)iVar11) {
                  iVar10 = (*right->_vptr_TType[10])(right);
                  if ((((*(ulong *)(CONCAT44(extraout_var_04,iVar10) + 8) & 0x40000000000) != 0) ||
                      (bVar9 = TType::sameArrayness(right,this_00), bVar9)) ||
                     (iVar10 = (*right->_vptr_TType[0x1e])(right), (char)iVar10 == '\0')) {
                    iVar10 = (*right->_vptr_TType[10])(right);
                    if (((*(ulong *)(CONCAT44(extraout_var_05,iVar10) + 8) & 0x40000000000) == 0) &&
                       (iVar10 = (*this_00->_vptr_TType[0x1d])(this_00), (char)iVar10 != '\0')) {
                      pTVar16 = (TString *)(**(code **)(*(long *)*__dest + 0x30))();
                      iVar10 = (*this_00->_vptr_TType[0xf])(this_00);
                      arrayLimitCheck(this,local_88,pTVar16,iVar10);
                    }
                  }
                  else {
                    lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(this,&local_78,"cannot change array size of redeclared block member",
                              *(undefined8 *)(lVar15 + 8),"");
                  }
                }
                else {
                  lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,&local_78,"cannot change arrayness of redeclared block member",
                             *(undefined8 *)(lVar15 + 8),"");
                }
                iVar10 = (*right->_vptr_TType[10])(right);
                if (((*(ulong *)(CONCAT44(extraout_var_06,iVar10) + 8) & 0x40000000000) == 0) ||
                   (iVar10 = (*this_00->_vptr_TType[0xb])(this_00),
                   (*(ulong *)(CONCAT44(extraout_var_07,iVar10) + 8) & 0x40000000000) != 0)) {
                  iVar10 = (*right->_vptr_TType[10])(right);
                  if (((*(ulong *)(CONCAT44(extraout_var_08,iVar10) + 8) & 0x40000000000) == 0) &&
                     (iVar10 = (*this_00->_vptr_TType[0xb])(this_00),
                     (*(ulong *)(CONCAT44(extraout_var_09,iVar10) + 8) & 0x40000000000) != 0)) {
                    lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                    pcVar23 = *(char **)(lVar15 + 8);
                    pp_Var24 = (this->super_TParseContextBase).super_TParseVersions.
                               _vptr_TParseVersions;
                    pTVar22 = &local_78;
                    pcVar18 = "cannot add perviewNV qualifier to redeclared block member";
                    goto LAB_0042e292;
                  }
                  iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                  if ((*(ulong *)(CONCAT44(extraout_var_10,iVar10) + 8) & 0x40000000000) != 0) {
                    iVar10 = (*right->_vptr_TType[0x14])(right);
                    lVar15 = *(long *)(CONCAT44(extraout_var_11,iVar10) + 8);
                    iVar10 = 0;
                    iVar11 = 0;
                    if (lVar15 != 0) {
                      iVar11 = (int)((ulong)(*(long *)(lVar15 + 0x10) - *(long *)(lVar15 + 8)) >> 4)
                      ;
                    }
                    iVar12 = (*this_00->_vptr_TType[0x13])(this_00);
                    lVar15 = *(long *)(CONCAT44(extraout_var_12,iVar12) + 8);
                    if (lVar15 != 0) {
                      iVar10 = (int)((ulong)(*(long *)(lVar15 + 0x10) - *(long *)(lVar15 + 8)) >> 4)
                      ;
                    }
                    if (iVar11 == iVar10) {
                      iVar10 = (*this_00->_vptr_TType[0x1f])(this_00);
                      this = local_58;
                      if (((char)iVar10 != '\0') ||
                         (iVar10 = (*this_00->_vptr_TType[0xf])(this_00),
                         iVar10 == (this->resources).maxMeshViewCountNV)) {
                        iVar10 = (*this_00->_vptr_TType[0x13])(this_00);
                        lVar15 = *(long *)(CONCAT44(extraout_var_13,iVar10) + 8);
                        if ((lVar15 != 0) &&
                           ((*(long *)(lVar15 + 0x10) - *(long *)(lVar15 + 8) & 0xffffffff0U) ==
                            0x20)) {
                          iVar10 = (*this_00->_vptr_TType[0x13])(this_00);
                          uVar13 = TSmallArrayVector::getDimSize
                                             ((TSmallArrayVector *)CONCAT44(extraout_var_14,iVar10),
                                              1);
                          pTVar16 = (TString *)(**(code **)(*(long *)*__dest + 0x30))();
                          arrayLimitCheck(this,&local_78,pTVar16,uVar13);
                          iVar10 = (*right->_vptr_TType[0x14])(right);
                          TSmallArrayVector::setDimSize
                                    ((TSmallArrayVector *)CONCAT44(extraout_var_15,iVar10),1,uVar13)
                          ;
                        }
                        goto LAB_0042e2a2;
                      }
                      pp_Var24 = (this->super_TParseContextBase).super_TParseVersions.
                                 _vptr_TParseVersions;
                      pcVar18 = 
                      "mesh view output array size must be gl_MaxMeshViewCountNV or implicitly sized"
                      ;
                      pcVar23 = "[]";
                      pTVar22 = local_88;
                    }
                    else {
                      lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                      pcVar23 = *(char **)(lVar15 + 8);
                      pp_Var24 = (local_58->super_TParseContextBase).super_TParseVersions.
                                 _vptr_TParseVersions;
                      pTVar22 = &local_78;
                      pcVar18 = "cannot change arrayness of redeclared block member";
                      this = local_58;
                    }
                    goto LAB_0042e292;
                  }
                }
                else {
                  lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                  pcVar23 = *(char **)(lVar15 + 8);
                  pp_Var24 = (this->super_TParseContextBase).super_TParseVersions.
                             _vptr_TParseVersions;
                  pcVar18 = "missing perviewNV qualifier to redeclared block member";
                  pTVar22 = &local_78;
LAB_0042e292:
                  (*pp_Var24[0x2d])(this,pTVar22,pcVar18,pcVar23,"");
                }
LAB_0042e2a2:
                iVar10 = (*right->_vptr_TType[10])(right);
                if ((*(ulong *)(CONCAT44(extraout_var_16,iVar10) + 8) & 0x20000000000) == 0) {
LAB_0042e2d2:
                  iVar10 = (*right->_vptr_TType[10])(right);
                  if ((*(ulong *)(CONCAT44(extraout_var_18,iVar10) + 8) & 0x20000000000) == 0) {
                    iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                    pcVar23 = "cannot add perprimitiveNV qualifier to redeclared block member";
                    if ((*(ulong *)(CONCAT44(extraout_var_19,iVar10) + 8) & 0x20000000000) != 0)
                    goto LAB_0042e2f8;
                  }
                }
                else {
                  iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                  pcVar23 = "missing perprimitiveNV qualifier to redeclared block member";
                  if ((*(ulong *)(CONCAT44(extraout_var_17,iVar10) + 8) & 0x20000000000) != 0)
                  goto LAB_0042e2d2;
LAB_0042e2f8:
                  lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                  (*(local_58->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                    [0x2d])(local_58,&local_78,pcVar23,*(undefined8 *)(lVar15 + 8),"");
                }
                iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                this = local_58;
                if ((*(uint *)(CONCAT44(extraout_var_20,iVar10) + 0xc) & 0x3ffc000) != 0) {
                  lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,&local_78,"cannot add memory qualifier to redeclared block member"
                             ,*(undefined8 *)(lVar15 + 8),"");
                }
                iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                bVar9 = TQualifier::hasNonXfbLayout((TQualifier *)CONCAT44(extraout_var_21,iVar10));
                if (bVar9) {
                  lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,&local_78,"cannot add non-XFB layout to redeclared block member",
                             *(undefined8 *)(lVar15 + 8),"");
                }
                iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                if ((*(byte *)(CONCAT44(extraout_var_22,iVar10) + 0xd) & 0x10) != 0) {
                  lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,&local_78,"cannot add patch to redeclared block member",
                             *(undefined8 *)(lVar15 + 8),"");
                }
                iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                if (((~*(uint *)(CONCAT44(extraout_var_23,iVar10) + 0x24) & 0xf) != 0) &&
                   (iVar10 = (*this_00->_vptr_TType[0xb])(this_00),
                   ((*(uint *)&(this->currentBlockQualifier).field_0x24 ^
                    *(uint *)(CONCAT44(extraout_var_24,iVar10) + 0x24)) & 0xf) != 0)) {
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,&local_78,
                             "member cannot contradict block (or what block inherited from global)",
                             "xfb_buffer","");
                }
                iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                if ((*(ulong *)(CONCAT44(extraout_var_25,iVar10) + 0x1c) < 0xff00000000000000) &&
                   (iVar10 = (*this_00->_vptr_TType[0xb])(this_00),
                   0xffffffffffffff <
                   (*(ulong *)&(this->currentBlockQualifier).field_0x1c ^
                   *(ulong *)(CONCAT44(extraout_var_26,iVar10) + 0x1c)))) {
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,&local_78,
                             "member cannot contradict block (or what block inherited from global)",
                             "xfb_stream","");
                }
                iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                uVar4 = *(undefined8 *)(CONCAT44(extraout_var_27,iVar10) + 8);
                iVar10 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_28,iVar10) + 8) =
                     *(ulong *)(CONCAT44(extraout_var_28,iVar10) + 8) & 0xffffffffdfffffff |
                     (ulong)((uint)uVar4 & 0x20000000);
                iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                uVar5 = *(ulong *)(CONCAT44(extraout_var_29,iVar10) + 8);
                iVar10 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_30,iVar10) + 8) =
                     *(ulong *)(CONCAT44(extraout_var_30,iVar10) + 8) & 0xffffdfffffffffff |
                     uVar5 & 0x200000000000;
                iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                uVar4 = *(undefined8 *)(CONCAT44(extraout_var_31,iVar10) + 8);
                iVar10 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_32,iVar10) + 8) =
                     *(ulong *)(CONCAT44(extraout_var_32,iVar10) + 8) & 0xffffffffefffffff |
                     (ulong)((uint)uVar4 & 0x10000000);
                iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                uVar5 = *(ulong *)(CONCAT44(extraout_var_33,iVar10) + 8);
                iVar10 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_34,iVar10) + 8) =
                     *(ulong *)(CONCAT44(extraout_var_34,iVar10) + 8) & 0xffffffefffffffff |
                     uVar5 & 0x1000000000;
                iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                uVar4 = *(undefined8 *)(CONCAT44(extraout_var_35,iVar10) + 8);
                iVar10 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_36,iVar10) + 8) =
                     *(ulong *)(CONCAT44(extraout_var_36,iVar10) + 8) & 0xffffffffbfffffff |
                     (ulong)((uint)uVar4 & 0x40000000);
                iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                uVar4 = *(undefined8 *)(CONCAT44(extraout_var_37,iVar10) + 8);
                iVar10 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_38,iVar10) + 8) =
                     *(ulong *)(CONCAT44(extraout_var_38,iVar10) + 8) & 0xffffffff7fffffff |
                     (ulong)((uint)uVar4 & 0x80000000);
                iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                uVar5 = *(ulong *)(CONCAT44(extraout_var_39,iVar10) + 8);
                iVar10 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_40,iVar10) + 8) =
                     *(ulong *)(CONCAT44(extraout_var_40,iVar10) + 8) & 0xffffffdfffffffff |
                     uVar5 & 0x2000000000;
                iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                uVar4 = *(undefined8 *)(CONCAT44(extraout_var_41,iVar10) + 0x24);
                iVar10 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_42,iVar10) + 0x24) =
                     *(ulong *)(CONCAT44(extraout_var_42,iVar10) + 0x24) & 0xffffffff8003ffff |
                     (ulong)((uint)uVar4 & 0x7ffc0000);
                iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                uVar4 = *(undefined8 *)(CONCAT44(extraout_var_43,iVar10) + 0x24);
                iVar10 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_44,iVar10) + 0x24) =
                     *(ulong *)(CONCAT44(extraout_var_44,iVar10) + 0x24) & 0xfffffffffffffff0 |
                     (ulong)((uint)uVar4 & 0xf);
                iVar10 = (*this_00->_vptr_TType[0xb])(this_00);
                uVar4 = *(undefined8 *)(CONCAT44(extraout_var_45,iVar10) + 0x24);
                iVar10 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_46,iVar10) + 0x24) =
                     *(ulong *)(CONCAT44(extraout_var_46,iVar10) + 0x24) & 0xfffffffffffc000f |
                     (ulong)((uint)uVar4 & 0x3fff0);
                iVar10 = (*right->_vptr_TType[10])(right);
                if ((*(uint *)(CONCAT44(extraout_var_47,iVar10) + 0x24) & 0x7ffc0000) != 0x3c0000) {
                  uVar4 = *(undefined8 *)&(this->currentBlockQualifier).field_0x24;
                  lVar15 = (**(code **)(*local_50 + 0x50))();
                  *(ulong *)(lVar15 + 0x24) =
                       *(ulong *)(lVar15 + 0x24) & 0xfffffffffffffff0 | (ulong)((uint)uVar4 & 0xf);
                  uVar4 = *(undefined8 *)&(this->currentBlockQualifier).field_0x24;
                  iVar10 = (*right->_vptr_TType[10])(right);
                  *(ulong *)(CONCAT44(extraout_var_48,iVar10) + 0x24) =
                       *(ulong *)(CONCAT44(extraout_var_48,iVar10) + 0x24) & 0xfffffffffffffff0 |
                       (ulong)((uint)uVar4 & 0xf);
                }
                iVar10 = (*right->_vptr_TType[0x1f])(right);
                if (((char)iVar10 != '\0') &&
                   (iVar10 = (*this_00->_vptr_TType[0x1e])(this_00), (char)iVar10 != '\0')) {
                  uVar13 = (*this_00->_vptr_TType[0xf])(this_00);
                  pTVar6 = right->arraySizes;
                  TSmallArrayVector::changeFront(&pTVar6->sizes,uVar13);
                  pTVar6->implicitlySized = false;
                }
                local_48 = local_48 + 1;
                layoutTypeCheck(this,local_88,right);
                pTVar16 = local_40;
                goto LAB_0042e780;
              }
            }
            if (pTVar16 == (TString *)0x0) {
              (**(code **)(*(long *)*__dest + 0x10))();
LAB_0042e780:
              __dest = __dest + 4;
              plVar14 = local_50;
            }
            else {
              cVar8 = (**(code **)(*local_50 + 0x128))(local_50);
              if (cVar8 == '\0') goto LAB_0042eafc;
              lVar15 = plVar14[0xd];
              __src = __dest + 4;
              puVar3 = *(undefined8 **)(lVar15 + 0x10);
              if (__src != puVar3) {
                memmove(__dest,__src,(long)puVar3 - (long)__src);
              }
              plVar1 = (long *)(lVar15 + 0x10);
              *plVar1 = *plVar1 + -0x20;
            }
            cVar8 = (**(code **)(*plVar14 + 0x128))(plVar14);
          } while (cVar8 != '\0');
        }
        __assert_fail("isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
      }
LAB_0042eafc:
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9e1,"TTypeList *glslang::TType::getWritableStruct() const");
    }
    pp_Var24 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar23 = "cannot redeclare a non block as a block";
  }
  (*pp_Var24[0x2d])(this,loc,pcVar23,pcVar19,"");
  return;
}

Assistant:

void TParseContext::redeclareBuiltinBlock(const TSourceLoc& loc, TTypeList& newTypeList, const TString& blockName,
    const TString* instanceName, TArraySizes* arraySizes)
{
    const char* feature = "built-in block redeclaration";
    profileRequires(loc, EEsProfile, 320, Num_AEP_shader_io_blocks, AEP_shader_io_blocks, feature);
    profileRequires(loc, ~EEsProfile, 410, E_GL_ARB_separate_shader_objects, feature);

    if (blockName != "gl_PerVertex" && blockName != "gl_PerFragment" &&
        blockName != "gl_MeshPerVertexNV" && blockName != "gl_MeshPerPrimitiveNV" &&
        blockName != "gl_MeshPerVertexEXT" && blockName != "gl_MeshPerPrimitiveEXT") {
        error(loc, "cannot redeclare block: ", "block declaration", blockName.c_str());
        return;
    }

    // Redeclaring a built-in block...

    if (instanceName && ! builtInName(*instanceName)) {
        error(loc, "cannot redeclare a built-in block with a user name", instanceName->c_str(), "");
        return;
    }

    // Blocks with instance names are easy to find, lookup the instance name,
    // Anonymous blocks need to be found via a member.
    bool builtIn;
    TSymbol* block;
    if (instanceName)
        block = symbolTable.find(*instanceName, &builtIn);
    else
        block = symbolTable.find(newTypeList.front().type->getFieldName(), &builtIn);

    // If the block was not found, this must be a version/profile/stage
    // that doesn't have it, or the instance name is wrong.
    const char* errorName = instanceName ? instanceName->c_str() : newTypeList.front().type->getFieldName().c_str();
    if (! block) {
        error(loc, "no declaration found for redeclaration", errorName, "");
        return;
    }
    // Built-in blocks cannot be redeclared more than once, which if happened,
    // we'd be finding the already redeclared one here, rather than the built in.
    if (! builtIn) {
        error(loc, "can only redeclare a built-in block once, and before any use", blockName.c_str(), "");
        return;
    }

    // Copy the block to make a writable version, to insert into the block table after editing.
    block = symbolTable.copyUpDeferredInsert(block);

    if (block->getType().getBasicType() != EbtBlock) {
        error(loc, "cannot redeclare a non block as a block", errorName, "");
        return;
    }

    // Fix XFB stuff up, it applies to the order of the redeclaration, not
    // the order of the original members.
    if (currentBlockQualifier.storage == EvqVaryingOut && globalOutputDefaults.hasXfbBuffer()) {
        if (!currentBlockQualifier.hasXfbBuffer())
            currentBlockQualifier.layoutXfbBuffer = globalOutputDefaults.layoutXfbBuffer;
        if (!currentBlockQualifier.hasStream())
            currentBlockQualifier.layoutStream = globalOutputDefaults.layoutStream;
        fixXfbOffsets(currentBlockQualifier, newTypeList);
    }

    // Edit and error check the container against the redeclaration
    //  - remove unused members
    //  - ensure remaining qualifiers/types match

    TType& type = block->getWritableType();

    // if gl_PerVertex is redeclared for the purpose of passing through "gl_Position"
    // for passthrough purpose, the redeclared block should have the same qualifers as
    // the current one
    if (currentBlockQualifier.layoutPassthrough) {
        type.getQualifier().layoutPassthrough = currentBlockQualifier.layoutPassthrough;
        type.getQualifier().storage = currentBlockQualifier.storage;
        type.getQualifier().layoutStream = currentBlockQualifier.layoutStream;
        type.getQualifier().layoutXfbBuffer = currentBlockQualifier.layoutXfbBuffer;
    }

    TTypeList::iterator member = type.getWritableStruct()->begin();
    size_t numOriginalMembersFound = 0;
    while (member != type.getStruct()->end()) {
        // look for match
        bool found = false;
        TTypeList::const_iterator newMember;
        TSourceLoc memberLoc;
        memberLoc.init();
        for (newMember = newTypeList.begin(); newMember != newTypeList.end(); ++newMember) {
            if (member->type->getFieldName() == newMember->type->getFieldName()) {
                found = true;
                memberLoc = newMember->loc;
                break;
            }
        }

        if (found) {
            ++numOriginalMembersFound;
            // - ensure match between redeclared members' types
            // - check for things that can't be changed
            // - update things that can be changed
            TType& oldType = *member->type;
            const TType& newType = *newMember->type;
            if (! newType.sameElementType(oldType))
                error(memberLoc, "cannot redeclare block member with a different type", member->type->getFieldName().c_str(), "");
            if (oldType.isArray() != newType.isArray())
                error(memberLoc, "cannot change arrayness of redeclared block member", member->type->getFieldName().c_str(), "");
            else if (! oldType.getQualifier().isPerView() && ! oldType.sameArrayness(newType) && oldType.isSizedArray())
                error(memberLoc, "cannot change array size of redeclared block member", member->type->getFieldName().c_str(), "");
            else if (! oldType.getQualifier().isPerView() && newType.isArray())
                arrayLimitCheck(loc, member->type->getFieldName(), newType.getOuterArraySize());
            if (oldType.getQualifier().isPerView() && ! newType.getQualifier().isPerView())
                error(memberLoc, "missing perviewNV qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            else if (! oldType.getQualifier().isPerView() && newType.getQualifier().isPerView())
                error(memberLoc, "cannot add perviewNV qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            else if (newType.getQualifier().isPerView()) {
                if (oldType.getArraySizes()->getNumDims() != newType.getArraySizes()->getNumDims())
                    error(memberLoc, "cannot change arrayness of redeclared block member", member->type->getFieldName().c_str(), "");
                else if (! newType.isUnsizedArray() && newType.getOuterArraySize() != resources.maxMeshViewCountNV)
                    error(loc, "mesh view output array size must be gl_MaxMeshViewCountNV or implicitly sized", "[]", "");
                else if (newType.getArraySizes()->getNumDims() == 2) {
                    int innerDimSize = newType.getArraySizes()->getDimSize(1);
                    arrayLimitCheck(memberLoc, member->type->getFieldName(), innerDimSize);
                    oldType.getArraySizes()->setDimSize(1, innerDimSize);
                }
            }
            if (oldType.getQualifier().isPerPrimitive() && ! newType.getQualifier().isPerPrimitive())
                error(memberLoc, "missing perprimitiveNV qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            else if (! oldType.getQualifier().isPerPrimitive() && newType.getQualifier().isPerPrimitive())
                error(memberLoc, "cannot add perprimitiveNV qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            if (newType.getQualifier().isMemory())
                error(memberLoc, "cannot add memory qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            if (newType.getQualifier().hasNonXfbLayout())
                error(memberLoc, "cannot add non-XFB layout to redeclared block member", member->type->getFieldName().c_str(), "");
            if (newType.getQualifier().patch)
                error(memberLoc, "cannot add patch to redeclared block member", member->type->getFieldName().c_str(), "");
            if (newType.getQualifier().hasXfbBuffer() &&
                newType.getQualifier().layoutXfbBuffer != currentBlockQualifier.layoutXfbBuffer)
                error(memberLoc, "member cannot contradict block (or what block inherited from global)", "xfb_buffer", "");
            if (newType.getQualifier().hasStream() &&
                newType.getQualifier().layoutStream != currentBlockQualifier.layoutStream)
                error(memberLoc, "member cannot contradict block (or what block inherited from global)", "xfb_stream", "");
            oldType.getQualifier().centroid = newType.getQualifier().centroid;
            oldType.getQualifier().sample = newType.getQualifier().sample;
            oldType.getQualifier().invariant = newType.getQualifier().invariant;
            oldType.getQualifier().noContraction = newType.getQualifier().noContraction;
            oldType.getQualifier().smooth = newType.getQualifier().smooth;
            oldType.getQualifier().flat = newType.getQualifier().flat;
            oldType.getQualifier().nopersp = newType.getQualifier().nopersp;
            oldType.getQualifier().layoutXfbOffset = newType.getQualifier().layoutXfbOffset;
            oldType.getQualifier().layoutXfbBuffer = newType.getQualifier().layoutXfbBuffer;
            oldType.getQualifier().layoutXfbStride = newType.getQualifier().layoutXfbStride;
            if (oldType.getQualifier().layoutXfbOffset != TQualifier::layoutXfbBufferEnd) {
                // If any member has an xfb_offset, then the block's xfb_buffer inherents current xfb_buffer,
                // and for xfb processing, the member needs it as well, along with xfb_stride.
                type.getQualifier().layoutXfbBuffer = currentBlockQualifier.layoutXfbBuffer;
                oldType.getQualifier().layoutXfbBuffer = currentBlockQualifier.layoutXfbBuffer;
            }
            if (oldType.isUnsizedArray() && newType.isSizedArray())
                oldType.changeOuterArraySize(newType.getOuterArraySize());

            //  check and process the member's type, which will include managing xfb information
            layoutTypeCheck(loc, oldType);

            // go to next member
            ++member;
        } else {
            // For missing members of anonymous blocks that have been redeclared,
            // hide the original (shared) declaration.
            // Instance-named blocks can just have the member removed.
            if (instanceName)
                member = type.getWritableStruct()->erase(member);
            else {
                member->type->hideMember();
                ++member;
            }
        }
    }

    if (spvVersion.vulkan > 0) {
        // ...then streams apply to built-in blocks, instead of them being only on stream 0
        type.getQualifier().layoutStream = currentBlockQualifier.layoutStream;
    }

    if (numOriginalMembersFound < newTypeList.size())
        error(loc, "block redeclaration has extra members", blockName.c_str(), "");
    if (type.isArray() != (arraySizes != nullptr) ||
        (type.isArray() && arraySizes != nullptr && type.getArraySizes()->getNumDims() != arraySizes->getNumDims()))
        error(loc, "cannot change arrayness of redeclared block", blockName.c_str(), "");
    else if (type.isArray()) {
        // At this point, we know both are arrays and both have the same number of dimensions.

        // It is okay for a built-in block redeclaration to be unsized, and keep the size of the
        // original block declaration.
        if (!arraySizes->isSized() && type.isSizedArray())
            arraySizes->changeOuterSize(type.getOuterArraySize());

        // And, okay to be giving a size to the array, by the redeclaration
        if (!type.isSizedArray() && arraySizes->isSized())
            type.changeOuterArraySize(arraySizes->getOuterSize());

        // Now, they must match in all dimensions.
        if (type.isSizedArray() && *type.getArraySizes() != *arraySizes)
            error(loc, "cannot change array size of redeclared block", blockName.c_str(), "");
    }

    symbolTable.insert(*block);

    // Check for general layout qualifier errors
    layoutObjectCheck(loc, *block);

    // Tracking for implicit sizing of array
    if (isIoResizeArray(block->getType())) {
        ioArraySymbolResizeList.push_back(block);
        checkIoArraysConsistency(loc, true);
    } else if (block->getType().isArray())
        fixIoArraySize(loc, block->getWritableType());

    // Save it in the AST for linker use.
    trackLinkage(*block);
}